

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O3

EncodingResult<kj::String> * __thiscall
kj::decodeUtf32(EncodingResult<kj::String> *__return_storage_ptr__,kj *this,
               ArrayPtr<const_char32_t> utf16)

{
  uint uVar1;
  undefined8 extraout_RAX;
  byte *pbVar2;
  char32_t *pcVar3;
  byte bVar4;
  bool bVar5;
  size_t sVar6;
  byte *pbVar7;
  char32_t *pcVar8;
  Vector<char> local_78;
  undefined8 local_50;
  EncodingResult<kj::String> *local_48;
  StringPtr local_40;
  
  pcVar3 = utf16.ptr;
  bVar5 = false;
  local_48 = __return_storage_ptr__;
  local_78.builder.ptr =
       (char *)_::HeapArrayDisposer::allocateImpl
                         (1,0,(long)pcVar3 + 1,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0
                         );
  local_78.builder.endPtr = (char *)((byte *)local_78.builder.ptr + (long)pcVar3 + 1);
  local_78.builder.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_78.builder.pos = local_78.builder.ptr;
  if (pcVar3 != (char32_t *)0x0) {
    pcVar8 = (char32_t *)0x0;
    local_50 = 0;
    do {
      uVar1 = *(uint *)(this + (long)pcVar8 * 4);
      bVar4 = (byte)uVar1;
      if (uVar1 < 0x80) {
        if (local_78.builder.pos == local_78.builder.endPtr) {
          sVar6 = ((long)local_78.builder.pos - (long)local_78.builder.ptr) * 2;
          if (local_78.builder.pos == local_78.builder.ptr) {
            sVar6 = 4;
          }
          Vector<char>::setCapacity(&local_78,sVar6);
        }
        *local_78.builder.pos = bVar4;
        local_78.builder.pos = local_78.builder.pos + 1;
      }
      else if (uVar1 < 0x800) {
        pbVar2 = (byte *)(local_78.builder.pos + (2 - (long)local_78.builder.ptr));
        if (local_78.builder.endPtr + -(long)local_78.builder.ptr < pbVar2) {
          pbVar7 = (byte *)((long)(local_78.builder.endPtr + -(long)local_78.builder.ptr) * 2);
          if (local_78.builder.endPtr == local_78.builder.ptr) {
            pbVar7 = (byte *)0x4;
          }
          if (pbVar7 < pbVar2) {
            pbVar7 = pbVar2;
          }
          Vector<char>::setCapacity(&local_78,(size_t)pbVar7);
        }
        *local_78.builder.pos = (byte)(uVar1 >> 6) | 0xc0;
        ((byte *)local_78.builder.pos)[1] = bVar4 & 0x3f | 0x80;
        local_78.builder.pos = (RemoveConst<char> *)((byte *)local_78.builder.pos + 2);
      }
      else if (uVar1 < 0x10000) {
        if ((uVar1 & 0xf800) == 0xd800) {
          local_50 = 0xd801;
        }
        pbVar2 = (byte *)(local_78.builder.pos + (3 - (long)local_78.builder.ptr));
        if (local_78.builder.endPtr + -(long)local_78.builder.ptr < pbVar2) {
          pbVar7 = (byte *)((long)(local_78.builder.endPtr + -(long)local_78.builder.ptr) * 2);
          if (local_78.builder.endPtr == local_78.builder.ptr) {
            pbVar7 = (byte *)0x4;
          }
          if (pbVar7 < pbVar2) {
            pbVar7 = pbVar2;
          }
          Vector<char>::setCapacity(&local_78,(size_t)pbVar7);
        }
        *local_78.builder.pos = (byte)(uVar1 >> 0xc) | 0xe0;
        ((byte *)local_78.builder.pos)[1] = (byte)(uVar1 >> 6) & 0x3f | 0x80;
        ((byte *)local_78.builder.pos)[2] = bVar4 & 0x3f | 0x80;
        local_78.builder.pos = (RemoveConst<char> *)((byte *)local_78.builder.pos + 3);
      }
      else if (uVar1 < 0x110000) {
        pbVar2 = (byte *)(local_78.builder.pos + (4 - (long)local_78.builder.ptr));
        if (local_78.builder.endPtr + -(long)local_78.builder.ptr < pbVar2) {
          pbVar7 = (byte *)((long)(local_78.builder.endPtr + -(long)local_78.builder.ptr) * 2);
          if (local_78.builder.endPtr == local_78.builder.ptr) {
            pbVar7 = (byte *)0x4;
          }
          if (pbVar7 < pbVar2) {
            pbVar7 = pbVar2;
          }
          Vector<char>::setCapacity(&local_78,(size_t)pbVar7);
        }
        *local_78.builder.pos = (byte)(uVar1 >> 0x12) | 0xf0;
        ((byte *)local_78.builder.pos)[1] = (byte)(uVar1 >> 0xc) & 0x3f | 0x80;
        ((byte *)local_78.builder.pos)[2] = (byte)(uVar1 >> 6) & 0x3f | 0x80;
        ((byte *)local_78.builder.pos)[3] = bVar4 & 0x3f | 0x80;
        local_78.builder.pos = (RemoveConst<char> *)((byte *)local_78.builder.pos + 4);
      }
      else {
        local_40.content.ptr = anon_var_dwarf_187b29;
        local_40.content.size_ = 4;
        Vector<char>::addAll<kj::StringPtr>(&local_78,&local_40);
        local_50 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      }
      pcVar8 = (char32_t *)((long)pcVar8 + 1);
    } while (pcVar3 != pcVar8);
    bVar5 = (bool)((byte)local_50 & 1);
  }
  if (local_78.builder.pos == local_78.builder.endPtr) {
    sVar6 = 4;
    if (local_78.builder.endPtr != local_78.builder.ptr) {
      sVar6 = ((long)local_78.builder.endPtr - (long)local_78.builder.ptr) * 2;
    }
    Vector<char>::setCapacity(&local_78,sVar6);
  }
  *local_78.builder.pos = 0;
  local_78.builder.pos = local_78.builder.pos + 1;
  if (local_78.builder.pos != local_78.builder.endPtr) {
    Vector<char>::setCapacity(&local_78,(long)local_78.builder.pos - (long)local_78.builder.ptr);
  }
  (local_48->super_String).content.ptr = local_78.builder.ptr;
  (local_48->super_String).content.size_ = (long)local_78.builder.pos - (long)local_78.builder.ptr;
  (local_48->super_String).content.disposer = local_78.builder.disposer;
  local_48->hadErrors = bVar5;
  return local_48;
}

Assistant:

EncodingResult<String> decodeUtf32(ArrayPtr<const char32_t> utf16) {
  Vector<char> result(utf16.size() + 1);
  bool hadErrors = false;

  size_t i = 0;
  while (i < utf16.size()) {
    char32_t u = utf16[i++];

    if (u < 0x80) {
      result.add(u);
      continue;
    } else if (u < 0x0800) {
      result.addAll<std::initializer_list<char>>({
        static_cast<char>(((u >>  6)       ) | 0xc0),
        static_cast<char>(((u      ) & 0x3f) | 0x80)
      });
      continue;
    } else if (u < 0x10000) {
      if (KJ_UNLIKELY((u & 0xfffff800) == 0xd800)) {
        // no surrogates allowed in utf-32
        hadErrors = true;
      }
      result.addAll<std::initializer_list<char>>({
        static_cast<char>(((u >> 12)       ) | 0xe0),
        static_cast<char>(((u >>  6) & 0x3f) | 0x80),
        static_cast<char>(((u      ) & 0x3f) | 0x80)
      });
      continue;
    } else {
      GOTO_ERROR_IF(u >= 0x110000);  // outside Unicode range
      result.addAll<std::initializer_list<char>>({
        static_cast<char>(((u >> 18)       ) | 0xf0),
        static_cast<char>(((u >> 12) & 0x3f) | 0x80),
        static_cast<char>(((u >>  6) & 0x3f) | 0x80),
        static_cast<char>(((u      ) & 0x3f) | 0x80)
      });
      continue;
    }

  error:
    result.addAll(StringPtr(u8"\ufffd"));
    hadErrors = true;
  }

  result.add(0);
  return { String(result.releaseAsArray()), hadErrors };
}